

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O3

void __thiscall
wallet::coinselector_tests::wallet_coinsresult_test::test_method(wallet_coinsresult_test *this)

{
  __buckets_ptr *ppp_Var1;
  long lVar2;
  __node_base _Var3;
  pointer pCVar4;
  uint32_t uVar5;
  long lVar6;
  pointer pCVar7;
  int iVar8;
  long lVar9;
  iterator pvVar10;
  iterator pvVar11;
  long in_FS_OFFSET;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  pair<std::__detail::_Node_iterator<COutPoint,_true,_false>,_bool> pVar26;
  check_type cVar27;
  int in_stack_fffffffffffffe08;
  undefined4 local_1ec;
  size_t local_1e8;
  undefined1 local_1e0 [16];
  undefined1 *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  vector<wallet::COutput,_std::allocator<wallet::COutput>_> local_170;
  vector<wallet::COutput,_std::allocator<wallet::COutput>_> local_158;
  undefined4 *local_140;
  assertion_result local_138;
  undefined4 **local_120;
  size_t *local_118;
  unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> dummyWallet;
  char *local_f0;
  unique_ptr<CConnman,_std::default_delete<CConnman>_> local_e8;
  assertion_result local_e0;
  unordered_set<COutPoint,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<COutPoint>_>
  outs_to_remove;
  CoinsResult available_coins;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header;
  available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  available_coins.total_amount = 0;
  available_coins.total_effective_amount.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_payload._M_value = 0;
  available_coins.total_effective_amount.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = true;
  ppp_Var1 = &outs_to_remove._M_h._M_buckets;
  outs_to_remove._M_h.
  super__Hashtable_base<COutPoint,_COutPoint,_std::__detail::_Identity,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  .
  super__Hash_code_base<COutPoint,_COutPoint,_std::__detail::_Identity,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_false>
  .super__Hashtable_ebo_helper<1,_SaltedOutpointHasher,_false>._M_tp.k0 = (uint64_t)ppp_Var1;
  available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       available_coins.coins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char_const*>((string *)&outs_to_remove,"dummy","");
  NewWallet((NodeContext *)&dummyWallet,
            (string *)
            (this->super_BasicTestingSetup).m_node.chain._M_t.
            super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
            super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
            super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl);
  if ((__buckets_ptr *)
      outs_to_remove._M_h.
      super__Hashtable_base<COutPoint,_COutPoint,_std::__detail::_Identity,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      .
      super__Hash_code_base<COutPoint,_COutPoint,_std::__detail::_Identity,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_false>
      .super__Hashtable_ebo_helper<1,_SaltedOutpointHasher,_false>._M_tp.k0 != ppp_Var1) {
    operator_delete((void *)outs_to_remove._M_h.
                            super__Hashtable_base<COutPoint,_COutPoint,_std::__detail::_Identity,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                            .
                            super__Hash_code_base<COutPoint,_COutPoint,_std::__detail::_Identity,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_false>
                            .super__Hashtable_ebo_helper<1,_SaltedOutpointHasher,_false>._M_tp.k0,
                    (long)outs_to_remove._M_h._M_buckets + 1);
  }
  iVar8 = 10;
  do {
    outs_to_remove._M_h.
    super__Hashtable_base<COutPoint,_COutPoint,_std::__detail::_Identity,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    .
    super__Hash_code_base<COutPoint,_COutPoint,_std::__detail::_Identity,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_false>
    .super__Hashtable_ebo_helper<1,_SaltedOutpointHasher,_false>._M_tp.k0 = 100000000;
    pvVar10 = (iterator)0x90;
    pvVar11 = (iterator)0x0;
    add_coin(&available_coins,
             (CWallet *)
             dummyWallet._M_t.
             super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
             super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
             super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CAmount *)&outs_to_remove
             ,(CFeeRate)0x0,0x90,false,0,false,in_stack_fffffffffffffe08);
    iVar8 = iVar8 + -1;
  } while (iVar8 != 0);
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::~unique_ptr(&dummyWallet)
  ;
  SaltedOutpointHasher::SaltedOutpointHasher((SaltedOutpointHasher *)&outs_to_remove,false);
  outs_to_remove._M_h._M_buckets = &outs_to_remove._M_h._M_single_bucket;
  outs_to_remove._M_h._M_bucket_count = 1;
  outs_to_remove._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  outs_to_remove._M_h._M_element_count = 0;
  outs_to_remove._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  outs_to_remove._M_h._M_rehash_policy._M_next_resize = 0;
  outs_to_remove._M_h._M_single_bucket = (__node_base_ptr)0x0;
  CoinsResult::All(&local_158,&available_coins);
  pVar26 = std::
           _Hashtable<COutPoint,COutPoint,std::allocator<COutPoint>,std::__detail::_Identity,std::equal_to<COutPoint>,SaltedOutpointHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
           ::_M_emplace<COutPoint_const&>
                     ((_Hashtable<COutPoint,COutPoint,std::allocator<COutPoint>,std::__detail::_Identity,std::equal_to<COutPoint>,SaltedOutpointHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                       *)&outs_to_remove,
                      &(local_158.
                        super__Vector_base<wallet::COutput,_std::allocator<wallet::COutput>_>.
                        _M_impl.super__Vector_impl_data._M_start)->outpoint);
  std::
  _Hashtable<COutPoint,COutPoint,std::allocator<COutPoint>,std::__detail::_Identity,std::equal_to<COutPoint>,SaltedOutpointHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_M_emplace<COutPoint_const&>
            ((_Hashtable<COutPoint,COutPoint,std::allocator<COutPoint>,std::__detail::_Identity,std::equal_to<COutPoint>,SaltedOutpointHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&outs_to_remove,
             &local_158.super__Vector_base<wallet::COutput,_std::allocator<wallet::COutput>_>.
              _M_impl.super__Vector_impl_data._M_start[1].outpoint,pVar26._8_8_);
  CoinsResult::Erase(&available_coins,&outs_to_remove);
  CoinsResult::All(&local_170,&available_coins);
  _Var3._M_nxt = outs_to_remove._M_h._M_before_begin._M_nxt;
  do {
    if (_Var3._M_nxt == (_Hash_node_base *)0x0) {
      local_1b0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
      ;
      local_1a8 = "";
      local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_00.m_end = (iterator)0x633;
      file_00.m_begin = (iterator)&local_1b0;
      msg_00.m_end = pvVar11;
      msg_00.m_begin = pvVar10;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1c0,
                 msg_00);
      local_1e0._8_8_ = local_1e0._8_8_ & 0xffffffffffffff00;
      local_1e0._0_8_ = &PTR__lazy_ostream_01388f08;
      local_1d0 = boost::unit_test::lazy_ostream::inst;
      local_1c8 = "";
      local_1e8 = CoinsResult::Size(&available_coins);
      local_118 = &local_1e8;
      local_140 = &local_1ec;
      local_1ec = 8;
      local_e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(local_1e8 == 8);
      local_e0.m_message.px = (element_type *)0x0;
      local_e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_f0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
      ;
      local_e8._M_t.super___uniq_ptr_impl<CConnman,_std::default_delete<CConnman>_>._M_t.
      super__Tuple_impl<0UL,_CConnman_*,_std::default_delete<CConnman>_>.
      super__Head_base<0UL,_CConnman_*,_false>._M_head_impl =
           (__uniq_ptr_data<CConnman,_std::default_delete<CConnman>,_true,_true>)
           ((long)
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
           + 0x72);
      dummyWallet._M_t.super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>
      ._M_t.super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
      super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl =
           (__uniq_ptr_data<wallet::CWallet,_std::default_delete<wallet::CWallet>,_true,_true>)
           &PTR__lazy_ostream_01388f48;
      local_120 = &local_140;
      local_138.m_message.px = (element_type *)(local_138.m_message._1_8_ << 8);
      local_138._0_8_ = &PTR__lazy_ostream_013890c8;
      local_138.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      boost::test_tools::tt_detail::report_assertion
                (&local_e0,(lazy_ostream *)local_1e0,1,2,REQUIRE,0xf5f1da,(size_t)&local_f0,0x633,
                 &dummyWallet,"8",&local_138);
      boost::detail::shared_count::~shared_count(&local_e0.m_message.pn);
      std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>::~vector(&local_170);
      std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>::~vector(&local_158);
      std::
      _Hashtable<COutPoint,_COutPoint,_std::allocator<COutPoint>,_std::__detail::_Identity,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&outs_to_remove._M_h);
      std::
      _Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
                   *)&available_coins);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        return;
      }
      __stack_chk_fail();
    }
    lVar9 = (long)local_170.super__Vector_base<wallet::COutput,_std::allocator<wallet::COutput>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_170.super__Vector_base<wallet::COutput,_std::allocator<wallet::COutput>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    lVar6 = (lVar9 >> 5) * -0x3333333333333333 >> 2;
    pCVar4 = local_170.super__Vector_base<wallet::COutput,_std::allocator<wallet::COutput>_>._M_impl
             .super__Vector_impl_data._M_start;
    if (0 < lVar6) {
      uVar5 = *(uint32_t *)&_Var3._M_nxt[5]._M_nxt;
      lVar9 = lVar6 + 1;
      pCVar7 = local_170.super__Vector_base<wallet::COutput,_std::allocator<wallet::COutput>_>.
               _M_impl.super__Vector_impl_data._M_start;
      do {
        auVar15[0] = -((pCVar7->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] ==
                      *(uchar *)&_Var3._M_nxt[1]._M_nxt);
        auVar15[1] = -((pCVar7->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] ==
                      *(uchar *)((long)&_Var3._M_nxt[1]._M_nxt + 1));
        auVar15[2] = -((pCVar7->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] ==
                      *(uchar *)((long)&_Var3._M_nxt[1]._M_nxt + 2));
        auVar15[3] = -((pCVar7->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] ==
                      *(uchar *)((long)&_Var3._M_nxt[1]._M_nxt + 3));
        auVar15[4] = -((pCVar7->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] ==
                      *(uchar *)((long)&_Var3._M_nxt[1]._M_nxt + 4));
        auVar15[5] = -((pCVar7->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] ==
                      *(uchar *)((long)&_Var3._M_nxt[1]._M_nxt + 5));
        auVar15[6] = -((pCVar7->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] ==
                      *(uchar *)((long)&_Var3._M_nxt[1]._M_nxt + 6));
        auVar15[7] = -((pCVar7->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] ==
                      *(uchar *)((long)&_Var3._M_nxt[1]._M_nxt + 7));
        auVar15[8] = -((pCVar7->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] ==
                      *(uchar *)&_Var3._M_nxt[2]._M_nxt);
        auVar15[9] = -((pCVar7->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] ==
                      *(uchar *)((long)&_Var3._M_nxt[2]._M_nxt + 1));
        auVar15[10] = -((pCVar7->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10]
                       == *(uchar *)((long)&_Var3._M_nxt[2]._M_nxt + 2));
        auVar15[0xb] = -((pCVar7->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                         [0xb] == *(uchar *)((long)&_Var3._M_nxt[2]._M_nxt + 3));
        auVar15[0xc] = -((pCVar7->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                         [0xc] == *(uchar *)((long)&_Var3._M_nxt[2]._M_nxt + 4));
        auVar15[0xd] = -((pCVar7->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                         [0xd] == *(uchar *)((long)&_Var3._M_nxt[2]._M_nxt + 5));
        auVar15[0xe] = -((pCVar7->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                         [0xe] == *(uchar *)((long)&_Var3._M_nxt[2]._M_nxt + 6));
        auVar15[0xf] = -((pCVar7->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                         [0xf] == *(uchar *)((long)&_Var3._M_nxt[2]._M_nxt + 7));
        auVar22[0] = -((pCVar7->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10]
                      == *(uchar *)&_Var3._M_nxt[3]._M_nxt);
        auVar22[1] = -((pCVar7->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11]
                      == *(uchar *)((long)&_Var3._M_nxt[3]._M_nxt + 1));
        auVar22[2] = -((pCVar7->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12]
                      == *(uchar *)((long)&_Var3._M_nxt[3]._M_nxt + 2));
        auVar22[3] = -((pCVar7->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13]
                      == *(uchar *)((long)&_Var3._M_nxt[3]._M_nxt + 3));
        auVar22[4] = -((pCVar7->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14]
                      == *(uchar *)((long)&_Var3._M_nxt[3]._M_nxt + 4));
        auVar22[5] = -((pCVar7->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15]
                      == *(uchar *)((long)&_Var3._M_nxt[3]._M_nxt + 5));
        auVar22[6] = -((pCVar7->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16]
                      == *(uchar *)((long)&_Var3._M_nxt[3]._M_nxt + 6));
        auVar22[7] = -((pCVar7->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17]
                      == *(uchar *)((long)&_Var3._M_nxt[3]._M_nxt + 7));
        auVar22[8] = -((pCVar7->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18]
                      == *(uchar *)&_Var3._M_nxt[4]._M_nxt);
        auVar22[9] = -((pCVar7->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19]
                      == *(uchar *)((long)&_Var3._M_nxt[4]._M_nxt + 1));
        auVar22[10] = -((pCVar7->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                        [0x1a] == *(uchar *)((long)&_Var3._M_nxt[4]._M_nxt + 2));
        auVar22[0xb] = -((pCVar7->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                         [0x1b] == *(uchar *)((long)&_Var3._M_nxt[4]._M_nxt + 3));
        auVar22[0xc] = -((pCVar7->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                         [0x1c] == *(uchar *)((long)&_Var3._M_nxt[4]._M_nxt + 4));
        auVar22[0xd] = -((pCVar7->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                         [0x1d] == *(uchar *)((long)&_Var3._M_nxt[4]._M_nxt + 5));
        auVar22[0xe] = -((pCVar7->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                         [0x1e] == *(uchar *)((long)&_Var3._M_nxt[4]._M_nxt + 6));
        auVar22[0xf] = -((pCVar7->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                         [0x1f] == *(uchar *)((long)&_Var3._M_nxt[4]._M_nxt + 7));
        auVar22 = auVar22 & auVar15;
        if (((ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe |
                     (ushort)(byte)(auVar22[0xf] >> 7) << 0xf) == 0xffff) &&
           ((pCVar7->outpoint).n == uVar5)) goto LAB_007b4a94;
        auVar23[0] = -(*(uchar *)&_Var3._M_nxt[1]._M_nxt ==
                      pCVar7[1].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0]);
        auVar23[1] = -(*(uchar *)((long)&_Var3._M_nxt[1]._M_nxt + 1) ==
                      pCVar7[1].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1]);
        auVar23[2] = -(*(uchar *)((long)&_Var3._M_nxt[1]._M_nxt + 2) ==
                      pCVar7[1].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2]);
        auVar23[3] = -(*(uchar *)((long)&_Var3._M_nxt[1]._M_nxt + 3) ==
                      pCVar7[1].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3]);
        auVar23[4] = -(*(uchar *)((long)&_Var3._M_nxt[1]._M_nxt + 4) ==
                      pCVar7[1].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4]);
        auVar23[5] = -(*(uchar *)((long)&_Var3._M_nxt[1]._M_nxt + 5) ==
                      pCVar7[1].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5]);
        auVar23[6] = -(*(uchar *)((long)&_Var3._M_nxt[1]._M_nxt + 6) ==
                      pCVar7[1].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6]);
        auVar23[7] = -(*(uchar *)((long)&_Var3._M_nxt[1]._M_nxt + 7) ==
                      pCVar7[1].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7]);
        auVar23[8] = -(*(uchar *)&_Var3._M_nxt[2]._M_nxt ==
                      pCVar7[1].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8]);
        auVar23[9] = -(*(uchar *)((long)&_Var3._M_nxt[2]._M_nxt + 1) ==
                      pCVar7[1].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9]);
        auVar23[10] = -(*(uchar *)((long)&_Var3._M_nxt[2]._M_nxt + 2) ==
                       pCVar7[1].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10]);
        auVar23[0xb] = -(*(uchar *)((long)&_Var3._M_nxt[2]._M_nxt + 3) ==
                        pCVar7[1].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb]
                        );
        auVar23[0xc] = -(*(uchar *)((long)&_Var3._M_nxt[2]._M_nxt + 4) ==
                        pCVar7[1].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc]
                        );
        auVar23[0xd] = -(*(uchar *)((long)&_Var3._M_nxt[2]._M_nxt + 5) ==
                        pCVar7[1].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd]
                        );
        auVar23[0xe] = -(*(uchar *)((long)&_Var3._M_nxt[2]._M_nxt + 6) ==
                        pCVar7[1].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe]
                        );
        auVar23[0xf] = -(*(uchar *)((long)&_Var3._M_nxt[2]._M_nxt + 7) ==
                        pCVar7[1].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf]
                        );
        auVar16[0] = -(*(uchar *)&_Var3._M_nxt[3]._M_nxt ==
                      pCVar7[1].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10])
        ;
        auVar16[1] = -(*(uchar *)((long)&_Var3._M_nxt[3]._M_nxt + 1) ==
                      pCVar7[1].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11])
        ;
        auVar16[2] = -(*(uchar *)((long)&_Var3._M_nxt[3]._M_nxt + 2) ==
                      pCVar7[1].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12])
        ;
        auVar16[3] = -(*(uchar *)((long)&_Var3._M_nxt[3]._M_nxt + 3) ==
                      pCVar7[1].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13])
        ;
        auVar16[4] = -(*(uchar *)((long)&_Var3._M_nxt[3]._M_nxt + 4) ==
                      pCVar7[1].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14])
        ;
        auVar16[5] = -(*(uchar *)((long)&_Var3._M_nxt[3]._M_nxt + 5) ==
                      pCVar7[1].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15])
        ;
        auVar16[6] = -(*(uchar *)((long)&_Var3._M_nxt[3]._M_nxt + 6) ==
                      pCVar7[1].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16])
        ;
        auVar16[7] = -(*(uchar *)((long)&_Var3._M_nxt[3]._M_nxt + 7) ==
                      pCVar7[1].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17])
        ;
        auVar16[8] = -(*(uchar *)&_Var3._M_nxt[4]._M_nxt ==
                      pCVar7[1].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18])
        ;
        auVar16[9] = -(*(uchar *)((long)&_Var3._M_nxt[4]._M_nxt + 1) ==
                      pCVar7[1].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19])
        ;
        auVar16[10] = -(*(uchar *)((long)&_Var3._M_nxt[4]._M_nxt + 2) ==
                       pCVar7[1].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a]
                       );
        auVar16[0xb] = -(*(uchar *)((long)&_Var3._M_nxt[4]._M_nxt + 3) ==
                        pCVar7[1].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                        [0x1b]);
        auVar16[0xc] = -(*(uchar *)((long)&_Var3._M_nxt[4]._M_nxt + 4) ==
                        pCVar7[1].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                        [0x1c]);
        auVar16[0xd] = -(*(uchar *)((long)&_Var3._M_nxt[4]._M_nxt + 5) ==
                        pCVar7[1].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                        [0x1d]);
        auVar16[0xe] = -(*(uchar *)((long)&_Var3._M_nxt[4]._M_nxt + 6) ==
                        pCVar7[1].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                        [0x1e]);
        auVar16[0xf] = -(*(uchar *)((long)&_Var3._M_nxt[4]._M_nxt + 7) ==
                        pCVar7[1].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                        [0x1f]);
        auVar16 = auVar16 & auVar23;
        if (((ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
                     (ushort)(byte)(auVar16[0xf] >> 7) << 0xf) == 0xffff) &&
           (pCVar7[1].outpoint.n == uVar5)) {
          pCVar7 = pCVar7 + 1;
          goto LAB_007b4a94;
        }
        auVar24[0] = -(*(uchar *)&_Var3._M_nxt[1]._M_nxt ==
                      pCVar7[2].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0]);
        auVar24[1] = -(*(uchar *)((long)&_Var3._M_nxt[1]._M_nxt + 1) ==
                      pCVar7[2].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1]);
        auVar24[2] = -(*(uchar *)((long)&_Var3._M_nxt[1]._M_nxt + 2) ==
                      pCVar7[2].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2]);
        auVar24[3] = -(*(uchar *)((long)&_Var3._M_nxt[1]._M_nxt + 3) ==
                      pCVar7[2].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3]);
        auVar24[4] = -(*(uchar *)((long)&_Var3._M_nxt[1]._M_nxt + 4) ==
                      pCVar7[2].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4]);
        auVar24[5] = -(*(uchar *)((long)&_Var3._M_nxt[1]._M_nxt + 5) ==
                      pCVar7[2].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5]);
        auVar24[6] = -(*(uchar *)((long)&_Var3._M_nxt[1]._M_nxt + 6) ==
                      pCVar7[2].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6]);
        auVar24[7] = -(*(uchar *)((long)&_Var3._M_nxt[1]._M_nxt + 7) ==
                      pCVar7[2].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7]);
        auVar24[8] = -(*(uchar *)&_Var3._M_nxt[2]._M_nxt ==
                      pCVar7[2].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8]);
        auVar24[9] = -(*(uchar *)((long)&_Var3._M_nxt[2]._M_nxt + 1) ==
                      pCVar7[2].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9]);
        auVar24[10] = -(*(uchar *)((long)&_Var3._M_nxt[2]._M_nxt + 2) ==
                       pCVar7[2].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10]);
        auVar24[0xb] = -(*(uchar *)((long)&_Var3._M_nxt[2]._M_nxt + 3) ==
                        pCVar7[2].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb]
                        );
        auVar24[0xc] = -(*(uchar *)((long)&_Var3._M_nxt[2]._M_nxt + 4) ==
                        pCVar7[2].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc]
                        );
        auVar24[0xd] = -(*(uchar *)((long)&_Var3._M_nxt[2]._M_nxt + 5) ==
                        pCVar7[2].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd]
                        );
        auVar24[0xe] = -(*(uchar *)((long)&_Var3._M_nxt[2]._M_nxt + 6) ==
                        pCVar7[2].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe]
                        );
        auVar24[0xf] = -(*(uchar *)((long)&_Var3._M_nxt[2]._M_nxt + 7) ==
                        pCVar7[2].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf]
                        );
        auVar17[0] = -(*(uchar *)&_Var3._M_nxt[3]._M_nxt ==
                      pCVar7[2].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10])
        ;
        auVar17[1] = -(*(uchar *)((long)&_Var3._M_nxt[3]._M_nxt + 1) ==
                      pCVar7[2].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11])
        ;
        auVar17[2] = -(*(uchar *)((long)&_Var3._M_nxt[3]._M_nxt + 2) ==
                      pCVar7[2].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12])
        ;
        auVar17[3] = -(*(uchar *)((long)&_Var3._M_nxt[3]._M_nxt + 3) ==
                      pCVar7[2].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13])
        ;
        auVar17[4] = -(*(uchar *)((long)&_Var3._M_nxt[3]._M_nxt + 4) ==
                      pCVar7[2].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14])
        ;
        auVar17[5] = -(*(uchar *)((long)&_Var3._M_nxt[3]._M_nxt + 5) ==
                      pCVar7[2].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15])
        ;
        auVar17[6] = -(*(uchar *)((long)&_Var3._M_nxt[3]._M_nxt + 6) ==
                      pCVar7[2].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16])
        ;
        auVar17[7] = -(*(uchar *)((long)&_Var3._M_nxt[3]._M_nxt + 7) ==
                      pCVar7[2].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17])
        ;
        auVar17[8] = -(*(uchar *)&_Var3._M_nxt[4]._M_nxt ==
                      pCVar7[2].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18])
        ;
        auVar17[9] = -(*(uchar *)((long)&_Var3._M_nxt[4]._M_nxt + 1) ==
                      pCVar7[2].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19])
        ;
        auVar17[10] = -(*(uchar *)((long)&_Var3._M_nxt[4]._M_nxt + 2) ==
                       pCVar7[2].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a]
                       );
        auVar17[0xb] = -(*(uchar *)((long)&_Var3._M_nxt[4]._M_nxt + 3) ==
                        pCVar7[2].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                        [0x1b]);
        auVar17[0xc] = -(*(uchar *)((long)&_Var3._M_nxt[4]._M_nxt + 4) ==
                        pCVar7[2].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                        [0x1c]);
        auVar17[0xd] = -(*(uchar *)((long)&_Var3._M_nxt[4]._M_nxt + 5) ==
                        pCVar7[2].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                        [0x1d]);
        auVar17[0xe] = -(*(uchar *)((long)&_Var3._M_nxt[4]._M_nxt + 6) ==
                        pCVar7[2].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                        [0x1e]);
        auVar17[0xf] = -(*(uchar *)((long)&_Var3._M_nxt[4]._M_nxt + 7) ==
                        pCVar7[2].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                        [0x1f]);
        auVar17 = auVar17 & auVar24;
        if (((ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
                     (ushort)(byte)(auVar17[0xf] >> 7) << 0xf) == 0xffff) &&
           (pCVar7[2].outpoint.n == uVar5)) {
          pCVar7 = pCVar7 + 2;
          goto LAB_007b4a94;
        }
        auVar25[0] = -(*(uchar *)&_Var3._M_nxt[1]._M_nxt ==
                      pCVar7[3].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0]);
        auVar25[1] = -(*(uchar *)((long)&_Var3._M_nxt[1]._M_nxt + 1) ==
                      pCVar7[3].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1]);
        auVar25[2] = -(*(uchar *)((long)&_Var3._M_nxt[1]._M_nxt + 2) ==
                      pCVar7[3].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2]);
        auVar25[3] = -(*(uchar *)((long)&_Var3._M_nxt[1]._M_nxt + 3) ==
                      pCVar7[3].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3]);
        auVar25[4] = -(*(uchar *)((long)&_Var3._M_nxt[1]._M_nxt + 4) ==
                      pCVar7[3].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4]);
        auVar25[5] = -(*(uchar *)((long)&_Var3._M_nxt[1]._M_nxt + 5) ==
                      pCVar7[3].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5]);
        auVar25[6] = -(*(uchar *)((long)&_Var3._M_nxt[1]._M_nxt + 6) ==
                      pCVar7[3].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6]);
        auVar25[7] = -(*(uchar *)((long)&_Var3._M_nxt[1]._M_nxt + 7) ==
                      pCVar7[3].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7]);
        auVar25[8] = -(*(uchar *)&_Var3._M_nxt[2]._M_nxt ==
                      pCVar7[3].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8]);
        auVar25[9] = -(*(uchar *)((long)&_Var3._M_nxt[2]._M_nxt + 1) ==
                      pCVar7[3].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9]);
        auVar25[10] = -(*(uchar *)((long)&_Var3._M_nxt[2]._M_nxt + 2) ==
                       pCVar7[3].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10]);
        auVar25[0xb] = -(*(uchar *)((long)&_Var3._M_nxt[2]._M_nxt + 3) ==
                        pCVar7[3].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb]
                        );
        auVar25[0xc] = -(*(uchar *)((long)&_Var3._M_nxt[2]._M_nxt + 4) ==
                        pCVar7[3].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc]
                        );
        auVar25[0xd] = -(*(uchar *)((long)&_Var3._M_nxt[2]._M_nxt + 5) ==
                        pCVar7[3].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd]
                        );
        auVar25[0xe] = -(*(uchar *)((long)&_Var3._M_nxt[2]._M_nxt + 6) ==
                        pCVar7[3].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe]
                        );
        auVar25[0xf] = -(*(uchar *)((long)&_Var3._M_nxt[2]._M_nxt + 7) ==
                        pCVar7[3].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf]
                        );
        auVar18[0] = -(*(uchar *)&_Var3._M_nxt[3]._M_nxt ==
                      pCVar7[3].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10])
        ;
        auVar18[1] = -(*(uchar *)((long)&_Var3._M_nxt[3]._M_nxt + 1) ==
                      pCVar7[3].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11])
        ;
        auVar18[2] = -(*(uchar *)((long)&_Var3._M_nxt[3]._M_nxt + 2) ==
                      pCVar7[3].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12])
        ;
        auVar18[3] = -(*(uchar *)((long)&_Var3._M_nxt[3]._M_nxt + 3) ==
                      pCVar7[3].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13])
        ;
        auVar18[4] = -(*(uchar *)((long)&_Var3._M_nxt[3]._M_nxt + 4) ==
                      pCVar7[3].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14])
        ;
        auVar18[5] = -(*(uchar *)((long)&_Var3._M_nxt[3]._M_nxt + 5) ==
                      pCVar7[3].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15])
        ;
        auVar18[6] = -(*(uchar *)((long)&_Var3._M_nxt[3]._M_nxt + 6) ==
                      pCVar7[3].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16])
        ;
        auVar18[7] = -(*(uchar *)((long)&_Var3._M_nxt[3]._M_nxt + 7) ==
                      pCVar7[3].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17])
        ;
        auVar18[8] = -(*(uchar *)&_Var3._M_nxt[4]._M_nxt ==
                      pCVar7[3].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18])
        ;
        auVar18[9] = -(*(uchar *)((long)&_Var3._M_nxt[4]._M_nxt + 1) ==
                      pCVar7[3].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19])
        ;
        auVar18[10] = -(*(uchar *)((long)&_Var3._M_nxt[4]._M_nxt + 2) ==
                       pCVar7[3].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a]
                       );
        auVar18[0xb] = -(*(uchar *)((long)&_Var3._M_nxt[4]._M_nxt + 3) ==
                        pCVar7[3].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                        [0x1b]);
        auVar18[0xc] = -(*(uchar *)((long)&_Var3._M_nxt[4]._M_nxt + 4) ==
                        pCVar7[3].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                        [0x1c]);
        auVar18[0xd] = -(*(uchar *)((long)&_Var3._M_nxt[4]._M_nxt + 5) ==
                        pCVar7[3].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                        [0x1d]);
        auVar18[0xe] = -(*(uchar *)((long)&_Var3._M_nxt[4]._M_nxt + 6) ==
                        pCVar7[3].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                        [0x1e]);
        auVar18[0xf] = -(*(uchar *)((long)&_Var3._M_nxt[4]._M_nxt + 7) ==
                        pCVar7[3].outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                        [0x1f]);
        auVar18 = auVar18 & auVar25;
        if (((ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                     (ushort)(byte)(auVar18[0xf] >> 7) << 0xf) == 0xffff) &&
           (pCVar7[3].outpoint.n == uVar5)) {
          pCVar7 = pCVar7 + 3;
          goto LAB_007b4a94;
        }
        pCVar7 = pCVar7 + 4;
        lVar9 = lVar9 + -1;
      } while (1 < lVar9);
      lVar9 = (long)local_170.super__Vector_base<wallet::COutput,_std::allocator<wallet::COutput>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(local_170.super__Vector_base<wallet::COutput,_std::allocator<wallet::COutput>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar6 * 4);
      pCVar4 = local_170.super__Vector_base<wallet::COutput,_std::allocator<wallet::COutput>_>.
               _M_impl.super__Vector_impl_data._M_start + lVar6 * 4;
    }
    lVar6 = (lVar9 >> 5) * -0x3333333333333333;
    if (lVar6 == 3) {
      auVar19[0] = -(*(uchar *)&_Var3._M_nxt[1]._M_nxt ==
                    (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0]);
      auVar19[1] = -(*(uchar *)((long)&_Var3._M_nxt[1]._M_nxt + 1) ==
                    (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1]);
      auVar19[2] = -(*(uchar *)((long)&_Var3._M_nxt[1]._M_nxt + 2) ==
                    (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2]);
      auVar19[3] = -(*(uchar *)((long)&_Var3._M_nxt[1]._M_nxt + 3) ==
                    (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3]);
      auVar19[4] = -(*(uchar *)((long)&_Var3._M_nxt[1]._M_nxt + 4) ==
                    (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4]);
      auVar19[5] = -(*(uchar *)((long)&_Var3._M_nxt[1]._M_nxt + 5) ==
                    (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5]);
      auVar19[6] = -(*(uchar *)((long)&_Var3._M_nxt[1]._M_nxt + 6) ==
                    (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6]);
      auVar19[7] = -(*(uchar *)((long)&_Var3._M_nxt[1]._M_nxt + 7) ==
                    (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7]);
      auVar19[8] = -(*(uchar *)&_Var3._M_nxt[2]._M_nxt ==
                    (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8]);
      auVar19[9] = -(*(uchar *)((long)&_Var3._M_nxt[2]._M_nxt + 1) ==
                    (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9]);
      auVar19[10] = -(*(uchar *)((long)&_Var3._M_nxt[2]._M_nxt + 2) ==
                     (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10]);
      auVar19[0xb] = -(*(uchar *)((long)&_Var3._M_nxt[2]._M_nxt + 3) ==
                      (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb]);
      auVar19[0xc] = -(*(uchar *)((long)&_Var3._M_nxt[2]._M_nxt + 4) ==
                      (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc]);
      auVar19[0xd] = -(*(uchar *)((long)&_Var3._M_nxt[2]._M_nxt + 5) ==
                      (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd]);
      auVar19[0xe] = -(*(uchar *)((long)&_Var3._M_nxt[2]._M_nxt + 6) ==
                      (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe]);
      auVar19[0xf] = -(*(uchar *)((long)&_Var3._M_nxt[2]._M_nxt + 7) ==
                      (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf]);
      auVar12[0] = -(*(uchar *)&_Var3._M_nxt[3]._M_nxt ==
                    (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10]);
      auVar12[1] = -(*(uchar *)((long)&_Var3._M_nxt[3]._M_nxt + 1) ==
                    (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11]);
      auVar12[2] = -(*(uchar *)((long)&_Var3._M_nxt[3]._M_nxt + 2) ==
                    (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12]);
      auVar12[3] = -(*(uchar *)((long)&_Var3._M_nxt[3]._M_nxt + 3) ==
                    (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13]);
      auVar12[4] = -(*(uchar *)((long)&_Var3._M_nxt[3]._M_nxt + 4) ==
                    (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14]);
      auVar12[5] = -(*(uchar *)((long)&_Var3._M_nxt[3]._M_nxt + 5) ==
                    (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15]);
      auVar12[6] = -(*(uchar *)((long)&_Var3._M_nxt[3]._M_nxt + 6) ==
                    (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16]);
      auVar12[7] = -(*(uchar *)((long)&_Var3._M_nxt[3]._M_nxt + 7) ==
                    (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17]);
      auVar12[8] = -(*(uchar *)&_Var3._M_nxt[4]._M_nxt ==
                    (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18]);
      auVar12[9] = -(*(uchar *)((long)&_Var3._M_nxt[4]._M_nxt + 1) ==
                    (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19]);
      auVar12[10] = -(*(uchar *)((long)&_Var3._M_nxt[4]._M_nxt + 2) ==
                     (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a]);
      auVar12[0xb] = -(*(uchar *)((long)&_Var3._M_nxt[4]._M_nxt + 3) ==
                      (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b])
      ;
      auVar12[0xc] = -(*(uchar *)((long)&_Var3._M_nxt[4]._M_nxt + 4) ==
                      (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c])
      ;
      auVar12[0xd] = -(*(uchar *)((long)&_Var3._M_nxt[4]._M_nxt + 5) ==
                      (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d])
      ;
      auVar12[0xe] = -(*(uchar *)((long)&_Var3._M_nxt[4]._M_nxt + 6) ==
                      (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e])
      ;
      auVar12[0xf] = -(*(uchar *)((long)&_Var3._M_nxt[4]._M_nxt + 7) ==
                      (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f])
      ;
      auVar12 = auVar12 & auVar19;
      uVar5 = *(uint32_t *)&_Var3._M_nxt[5]._M_nxt;
      if (((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                   (ushort)(byte)(auVar12[0xf] >> 7) << 0xf) != 0xffff) ||
         (pCVar7 = pCVar4, (pCVar4->outpoint).n != uVar5)) {
        pCVar4 = pCVar4 + 1;
        goto LAB_007b4a0e;
      }
    }
    else {
      if (lVar6 == 2) {
        uVar5 = *(uint32_t *)&_Var3._M_nxt[5]._M_nxt;
LAB_007b4a0e:
        auVar20[0] = -(*(uchar *)&_Var3._M_nxt[1]._M_nxt ==
                      (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0]);
        auVar20[1] = -(*(uchar *)((long)&_Var3._M_nxt[1]._M_nxt + 1) ==
                      (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1]);
        auVar20[2] = -(*(uchar *)((long)&_Var3._M_nxt[1]._M_nxt + 2) ==
                      (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2]);
        auVar20[3] = -(*(uchar *)((long)&_Var3._M_nxt[1]._M_nxt + 3) ==
                      (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3]);
        auVar20[4] = -(*(uchar *)((long)&_Var3._M_nxt[1]._M_nxt + 4) ==
                      (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4]);
        auVar20[5] = -(*(uchar *)((long)&_Var3._M_nxt[1]._M_nxt + 5) ==
                      (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5]);
        auVar20[6] = -(*(uchar *)((long)&_Var3._M_nxt[1]._M_nxt + 6) ==
                      (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6]);
        auVar20[7] = -(*(uchar *)((long)&_Var3._M_nxt[1]._M_nxt + 7) ==
                      (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7]);
        auVar20[8] = -(*(uchar *)&_Var3._M_nxt[2]._M_nxt ==
                      (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8]);
        auVar20[9] = -(*(uchar *)((long)&_Var3._M_nxt[2]._M_nxt + 1) ==
                      (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9]);
        auVar20[10] = -(*(uchar *)((long)&_Var3._M_nxt[2]._M_nxt + 2) ==
                       (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10]);
        auVar20[0xb] = -(*(uchar *)((long)&_Var3._M_nxt[2]._M_nxt + 3) ==
                        (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb]
                        );
        auVar20[0xc] = -(*(uchar *)((long)&_Var3._M_nxt[2]._M_nxt + 4) ==
                        (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc]
                        );
        auVar20[0xd] = -(*(uchar *)((long)&_Var3._M_nxt[2]._M_nxt + 5) ==
                        (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd]
                        );
        auVar20[0xe] = -(*(uchar *)((long)&_Var3._M_nxt[2]._M_nxt + 6) ==
                        (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe]
                        );
        auVar20[0xf] = -(*(uchar *)((long)&_Var3._M_nxt[2]._M_nxt + 7) ==
                        (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf]
                        );
        auVar13[0] = -(*(uchar *)&_Var3._M_nxt[3]._M_nxt ==
                      (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10])
        ;
        auVar13[1] = -(*(uchar *)((long)&_Var3._M_nxt[3]._M_nxt + 1) ==
                      (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11])
        ;
        auVar13[2] = -(*(uchar *)((long)&_Var3._M_nxt[3]._M_nxt + 2) ==
                      (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12])
        ;
        auVar13[3] = -(*(uchar *)((long)&_Var3._M_nxt[3]._M_nxt + 3) ==
                      (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13])
        ;
        auVar13[4] = -(*(uchar *)((long)&_Var3._M_nxt[3]._M_nxt + 4) ==
                      (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14])
        ;
        auVar13[5] = -(*(uchar *)((long)&_Var3._M_nxt[3]._M_nxt + 5) ==
                      (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15])
        ;
        auVar13[6] = -(*(uchar *)((long)&_Var3._M_nxt[3]._M_nxt + 6) ==
                      (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16])
        ;
        auVar13[7] = -(*(uchar *)((long)&_Var3._M_nxt[3]._M_nxt + 7) ==
                      (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17])
        ;
        auVar13[8] = -(*(uchar *)&_Var3._M_nxt[4]._M_nxt ==
                      (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18])
        ;
        auVar13[9] = -(*(uchar *)((long)&_Var3._M_nxt[4]._M_nxt + 1) ==
                      (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19])
        ;
        auVar13[10] = -(*(uchar *)((long)&_Var3._M_nxt[4]._M_nxt + 2) ==
                       (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a]
                       );
        auVar13[0xb] = -(*(uchar *)((long)&_Var3._M_nxt[4]._M_nxt + 3) ==
                        (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                        [0x1b]);
        auVar13[0xc] = -(*(uchar *)((long)&_Var3._M_nxt[4]._M_nxt + 4) ==
                        (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                        [0x1c]);
        auVar13[0xd] = -(*(uchar *)((long)&_Var3._M_nxt[4]._M_nxt + 5) ==
                        (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                        [0x1d]);
        auVar13[0xe] = -(*(uchar *)((long)&_Var3._M_nxt[4]._M_nxt + 6) ==
                        (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                        [0x1e]);
        auVar13[0xf] = -(*(uchar *)((long)&_Var3._M_nxt[4]._M_nxt + 7) ==
                        (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                        [0x1f]);
        auVar13 = auVar13 & auVar20;
        if (((ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
                     (ushort)(byte)(auVar13[0xf] >> 7) << 0xf) == 0xffff) &&
           (pCVar7 = pCVar4, (pCVar4->outpoint).n == uVar5)) goto LAB_007b4a94;
        pCVar4 = pCVar4 + 1;
      }
      else {
        pCVar7 = local_170.super__Vector_base<wallet::COutput,_std::allocator<wallet::COutput>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (lVar6 != 1) goto LAB_007b4a94;
        uVar5 = *(uint32_t *)&_Var3._M_nxt[5]._M_nxt;
      }
      auVar21[0] = -(*(uchar *)&_Var3._M_nxt[1]._M_nxt ==
                    (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0]);
      auVar21[1] = -(*(uchar *)((long)&_Var3._M_nxt[1]._M_nxt + 1) ==
                    (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1]);
      auVar21[2] = -(*(uchar *)((long)&_Var3._M_nxt[1]._M_nxt + 2) ==
                    (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2]);
      auVar21[3] = -(*(uchar *)((long)&_Var3._M_nxt[1]._M_nxt + 3) ==
                    (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3]);
      auVar21[4] = -(*(uchar *)((long)&_Var3._M_nxt[1]._M_nxt + 4) ==
                    (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4]);
      auVar21[5] = -(*(uchar *)((long)&_Var3._M_nxt[1]._M_nxt + 5) ==
                    (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5]);
      auVar21[6] = -(*(uchar *)((long)&_Var3._M_nxt[1]._M_nxt + 6) ==
                    (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6]);
      auVar21[7] = -(*(uchar *)((long)&_Var3._M_nxt[1]._M_nxt + 7) ==
                    (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7]);
      auVar21[8] = -(*(uchar *)&_Var3._M_nxt[2]._M_nxt ==
                    (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8]);
      auVar21[9] = -(*(uchar *)((long)&_Var3._M_nxt[2]._M_nxt + 1) ==
                    (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9]);
      auVar21[10] = -(*(uchar *)((long)&_Var3._M_nxt[2]._M_nxt + 2) ==
                     (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10]);
      auVar21[0xb] = -(*(uchar *)((long)&_Var3._M_nxt[2]._M_nxt + 3) ==
                      (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb]);
      auVar21[0xc] = -(*(uchar *)((long)&_Var3._M_nxt[2]._M_nxt + 4) ==
                      (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc]);
      auVar21[0xd] = -(*(uchar *)((long)&_Var3._M_nxt[2]._M_nxt + 5) ==
                      (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd]);
      auVar21[0xe] = -(*(uchar *)((long)&_Var3._M_nxt[2]._M_nxt + 6) ==
                      (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe]);
      auVar21[0xf] = -(*(uchar *)((long)&_Var3._M_nxt[2]._M_nxt + 7) ==
                      (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf]);
      auVar14[0] = -(*(uchar *)&_Var3._M_nxt[3]._M_nxt ==
                    (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10]);
      auVar14[1] = -(*(uchar *)((long)&_Var3._M_nxt[3]._M_nxt + 1) ==
                    (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11]);
      auVar14[2] = -(*(uchar *)((long)&_Var3._M_nxt[3]._M_nxt + 2) ==
                    (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12]);
      auVar14[3] = -(*(uchar *)((long)&_Var3._M_nxt[3]._M_nxt + 3) ==
                    (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13]);
      auVar14[4] = -(*(uchar *)((long)&_Var3._M_nxt[3]._M_nxt + 4) ==
                    (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14]);
      auVar14[5] = -(*(uchar *)((long)&_Var3._M_nxt[3]._M_nxt + 5) ==
                    (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15]);
      auVar14[6] = -(*(uchar *)((long)&_Var3._M_nxt[3]._M_nxt + 6) ==
                    (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16]);
      auVar14[7] = -(*(uchar *)((long)&_Var3._M_nxt[3]._M_nxt + 7) ==
                    (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17]);
      auVar14[8] = -(*(uchar *)&_Var3._M_nxt[4]._M_nxt ==
                    (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18]);
      auVar14[9] = -(*(uchar *)((long)&_Var3._M_nxt[4]._M_nxt + 1) ==
                    (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19]);
      auVar14[10] = -(*(uchar *)((long)&_Var3._M_nxt[4]._M_nxt + 2) ==
                     (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a]);
      auVar14[0xb] = -(*(uchar *)((long)&_Var3._M_nxt[4]._M_nxt + 3) ==
                      (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b])
      ;
      auVar14[0xc] = -(*(uchar *)((long)&_Var3._M_nxt[4]._M_nxt + 4) ==
                      (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c])
      ;
      auVar14[0xd] = -(*(uchar *)((long)&_Var3._M_nxt[4]._M_nxt + 5) ==
                      (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d])
      ;
      auVar14[0xe] = -(*(uchar *)((long)&_Var3._M_nxt[4]._M_nxt + 6) ==
                      (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e])
      ;
      auVar14[0xf] = -(*(uchar *)((long)&_Var3._M_nxt[4]._M_nxt + 7) ==
                      (pCVar4->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f])
      ;
      auVar14 = auVar14 & auVar21;
      pCVar7 = local_170.super__Vector_base<wallet::COutput,_std::allocator<wallet::COutput>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (uVar5 == (pCVar4->outpoint).n &&
          (ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar14[0xf] >> 7) << 0xf) == 0xffff) {
        pCVar7 = pCVar4;
      }
    }
LAB_007b4a94:
    local_180 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_178 = "";
    local_190 = &boost::unit_test::basic_cstring<char_const>::null;
    local_188 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar27 = 0x7b4ac6;
    file.m_end = (iterator)0x630;
    file.m_begin = (iterator)&local_180;
    msg.m_end = pvVar11;
    msg.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_190,msg);
    local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (readonly_property<bool>)
         (pCVar7 ==
         local_170.super__Vector_base<wallet::COutput,_std::allocator<wallet::COutput>_>._M_impl.
         super__Vector_impl_data._M_finish);
    local_138.m_message.px = (element_type *)0x0;
    local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_1e0._0_8_ = "it == updated_coins.end()";
    local_1e0._8_8_ = "";
    dummyWallet._M_t.super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>.
    _M_t.super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
    super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl =
         (__uniq_ptr_data<wallet::CWallet,_std::default_delete<wallet::CWallet>,_true,_true>)
         &PTR__lazy_ostream_01389048;
    local_1a0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_198 = "";
    pvVar10 = (iterator)0x1;
    pvVar11 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_138,(lazy_ostream *)&dummyWallet,1,0,WARN,_cVar27,(size_t)&local_1a0,0x630);
    boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
    _Var3._M_nxt = (_Var3._M_nxt)->_M_nxt;
  } while( true );
}

Assistant:

BOOST_FIXTURE_TEST_CASE(wallet_coinsresult_test, BasicTestingSetup)
{
    // Test case to verify CoinsResult object sanity.
    CoinsResult available_coins;
    {
        std::unique_ptr<CWallet> dummyWallet = NewWallet(m_node, /*wallet_name=*/"dummy");

        // Add some coins to 'available_coins'
        for (int i=0; i<10; i++) {
            add_coin(available_coins, *dummyWallet, 1 * COIN);
        }
    }

    {
        // First test case, check that 'CoinsResult::Erase' function works as expected.
        // By trying to erase two elements from the 'available_coins' object.
        std::unordered_set<COutPoint, SaltedOutpointHasher> outs_to_remove;
        const auto& coins = available_coins.All();
        for (int i = 0; i < 2; i++) {
            outs_to_remove.emplace(coins[i].outpoint);
        }
        available_coins.Erase(outs_to_remove);

        // Check that the elements were actually removed.
        const auto& updated_coins = available_coins.All();
        for (const auto& out: outs_to_remove) {
            auto it = std::find_if(updated_coins.begin(), updated_coins.end(), [&out](const COutput &coin) {
                return coin.outpoint == out;
            });
            BOOST_CHECK(it == updated_coins.end());
        }
        // And verify that no extra element were removed
        BOOST_CHECK_EQUAL(available_coins.Size(), 8);
    }
}